

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O3

void value_count_suite::run(void)

{
  count_null();
  count_boolean();
  count_integer();
  count_real();
  count_string();
  count_array();
  count_map();
  return;
}

Assistant:

void run()
{
    count_null();
    count_boolean();
    count_integer();
    count_real();
    count_string();
    count_array();
    count_map();
}